

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

int __thiscall ncnn::Net::load_param(Net *this,DataReader *dr)

{
  vector<int,_std::allocator<int>_> *this_00;
  pointer pBVar1;
  Net *pNVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  Layer *pLVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  size_t sStack_cc0;
  allocator<char> local_ca9;
  int local_ca8;
  int top_count;
  int bottom_count;
  int blob_count;
  ulong local_c98;
  int layer_count;
  Net *local_c88;
  vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *local_c80;
  int local_c78;
  int magic;
  Layer *local_c70;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_c68;
  ulong local_c60;
  allocator<char> local_c58 [32];
  char bottom_name [256];
  char layer_type [256];
  char layer_name [256];
  ParamDict pd;
  
  magic = 0;
  local_c88 = this;
  iVar3 = (*dr->_vptr_DataReader[2])(dr,"%d");
  if (iVar3 == 1) {
    if (magic == 0x7685dd) {
      layer_count = 0;
      blob_count = 0;
      iVar3 = (*dr->_vptr_DataReader[2])(dr,"%d");
      if (iVar3 == 1) {
        iVar3 = (*dr->_vptr_DataReader[2])(dr,"%d",&blob_count);
        pNVar2 = local_c88;
        if (iVar3 == 1) {
          if ((0 < (long)layer_count) && (0 < blob_count)) {
            local_c68 = &local_c88->layers;
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                      (local_c68,(long)layer_count);
            local_c80 = &pNVar2->blobs;
            std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize(local_c80,(long)blob_count)
            ;
            ParamDict::ParamDict(&pd);
            uVar5 = 0;
            local_c98 = 0;
            do {
              local_ca8 = (int)uVar5;
              iVar3 = layer_count;
              if (layer_count <= local_ca8) {
LAB_0011ca3e:
                ParamDict::~ParamDict(&pd);
                return -(uint)((int)uVar5 < iVar3);
              }
              local_c78 = layer_count;
              bottom_count = 0;
              top_count = 0;
              local_c60 = uVar5;
              iVar3 = (*dr->_vptr_DataReader[2])(dr,"%255s",layer_type);
              if (iVar3 != 1) {
                pcVar7 = "parse layer_type failed\n";
LAB_0011cb01:
                sStack_cc0 = 0x18;
LAB_0011ca2c:
                fwrite(pcVar7,sStack_cc0,1,_stderr);
                uVar5 = local_c60;
                iVar3 = local_c78;
                goto LAB_0011ca3e;
              }
              iVar3 = (*dr->_vptr_DataReader[2])(dr,"%255s",layer_name);
              if (iVar3 != 1) {
                pcVar7 = "parse layer_name failed\n";
                goto LAB_0011cb01;
              }
              iVar3 = (*dr->_vptr_DataReader[2])(dr,"%d",&bottom_count);
              if (iVar3 != 1) {
                pcVar7 = "parse bottom_count failed\n";
                sStack_cc0 = 0x1a;
                goto LAB_0011ca2c;
              }
              iVar3 = (*dr->_vptr_DataReader[2])(dr,"%d",&top_count);
              if (iVar3 != 1) {
                pcVar7 = "parse top_count failed\n";
LAB_0011ca2a:
                sStack_cc0 = 0x17;
                goto LAB_0011ca2c;
              }
              pLVar6 = create_layer(layer_type);
              if ((pLVar6 == (Layer *)0x0) &&
                 (pLVar6 = create_custom_layer(local_c88,layer_type), pLVar6 == (Layer *)0x0)) {
                fprintf(_stderr,"layer %s not exists or registered\n",layer_type);
                clear(local_c88);
                uVar5 = local_c60;
                iVar3 = local_c78;
                goto LAB_0011ca3e;
              }
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)bottom_name,layer_type,local_c58);
              std::__cxx11::string::operator=((string *)&pLVar6->type,(string *)bottom_name);
              std::__cxx11::string::~string((string *)bottom_name);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)bottom_name,layer_name,local_c58);
              std::__cxx11::string::operator=((string *)&pLVar6->name,(string *)bottom_name);
              std::__cxx11::string::~string((string *)bottom_name);
              std::vector<int,_std::allocator<int>_>::resize(&pLVar6->bottoms,(long)bottom_count);
              lVar9 = 0;
              local_c70 = pLVar6;
              while( true ) {
                uVar5 = local_c98;
                iVar3 = (int)local_c98;
                lVar8 = (long)(int)local_c98;
                if (bottom_count <= lVar9) break;
                iVar4 = (*dr->_vptr_DataReader[2])(dr,"%255s",bottom_name);
                if (iVar4 != 1) {
                  pcVar7 = "parse bottom_name failed\n";
                  sStack_cc0 = 0x19;
                  goto LAB_0011ca2c;
                }
                iVar4 = find_blob_index_by_name(local_c88,bottom_name);
                if (iVar4 == -1) {
                  pBVar1 = (local_c80->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)local_c58,bottom_name,&local_ca9);
                  std::__cxx11::string::operator=((string *)(pBVar1 + lVar8),(string *)local_c58);
                  std::__cxx11::string::~string((string *)local_c58);
                  iVar4 = (int)local_c98;
                  local_c98 = (ulong)(iVar3 + 1);
                }
                else {
                  lVar8 = (long)iVar4;
                }
                std::vector<int,_std::allocator<int>_>::push_back
                          (&(local_c80->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)
                            ._M_impl.super__Vector_impl_data._M_start[lVar8].consumers,&local_ca8);
                (pLVar6->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar9] = iVar4;
                lVar9 = lVar9 + 1;
              }
              this_00 = &local_c70->tops;
              std::vector<int,_std::allocator<int>_>::resize(this_00,(long)top_count);
              local_c98 = uVar5 & 0xffffffff;
              lVar8 = lVar8 << 6;
              for (lVar9 = 0; lVar9 < top_count; lVar9 = lVar9 + 1) {
                pBVar1 = (local_c80->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                         _M_impl.super__Vector_impl_data._M_start;
                iVar3 = (*dr->_vptr_DataReader[2])(dr,"%255s",bottom_name);
                if (iVar3 != 1) {
                  pcVar7 = "parse blob_name failed\n";
                  goto LAB_0011ca2a;
                }
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_c58,bottom_name,&local_ca9);
                std::__cxx11::string::operator=
                          ((string *)((long)&(pBVar1->name)._M_dataplus._M_p + lVar8),
                           (string *)local_c58);
                std::__cxx11::string::~string((string *)local_c58);
                *(int *)((long)&pBVar1->producer + lVar8) = local_ca8;
                (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar9] = (int)local_c98 + (int)lVar9;
                lVar8 = lVar8 + 0x40;
              }
              iVar3 = ParamDict::load_param(&pd,dr);
              pLVar6 = local_c70;
              if (iVar3 == 0) {
                iVar3 = (*local_c70->_vptr_Layer[2])(local_c70,&pd);
                if (iVar3 != 0) {
                  pcVar7 = "layer load_param failed\n";
                  sStack_cc0 = 0x18;
                  goto LAB_0011c9f9;
                }
                (local_c68->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                _M_impl.super__Vector_impl_data._M_start[local_ca8] = pLVar6;
              }
              else {
                pcVar7 = "ParamDict load_param failed\n";
                sStack_cc0 = 0x1c;
LAB_0011c9f9:
                fwrite(pcVar7,sStack_cc0,1,_stderr);
              }
              local_c98 = local_c98 + lVar9;
              uVar5 = (ulong)(local_ca8 + 1);
            } while( true );
          }
          pcVar7 = "invalid layer_count or blob_count\n";
          sStack_cc0 = 0x22;
        }
        else {
          pcVar7 = "parse blob_count failed\n";
          sStack_cc0 = 0x18;
        }
      }
      else {
        pcVar7 = "parse layer_count failed\n";
        sStack_cc0 = 0x19;
      }
    }
    else {
      pcVar7 = "param is too old, please regenerate\n";
      sStack_cc0 = 0x24;
    }
  }
  else {
    pcVar7 = "parse magic failed\n";
    sStack_cc0 = 0x13;
  }
  fwrite(pcVar7,sStack_cc0,1,_stderr);
  return -1;
}

Assistant:

int Net::load_param(const DataReader& dr)
{
#define SCAN_VALUE(fmt, v) \
    if (dr.scan(fmt, &v) != 1) \
    { \
        fprintf(stderr, "parse " #v " failed\n"); \
        return -1; \
    }

    int magic = 0;
    SCAN_VALUE("%d", magic)
    if (magic != 7767517)
    {
        fprintf(stderr, "param is too old, please regenerate\n");
        return -1;
    }

    // parse
    int layer_count = 0;
    int blob_count = 0;
    SCAN_VALUE("%d", layer_count)
    SCAN_VALUE("%d", blob_count)
    if (layer_count <= 0 || blob_count <= 0)
    {
        fprintf(stderr, "invalid layer_count or blob_count\n");
        return -1;
    }

    layers.resize((size_t)layer_count);
    blobs.resize((size_t)blob_count);

#if NCNN_VULKAN
    if (opt.use_vulkan_compute)
    {
        if (!vkdev) vkdev = get_gpu_device();
        if (!vkdev) opt.use_vulkan_compute = false;// no vulkan device, fallback to cpu
    }
    if (opt.use_vulkan_compute)
    {
        // sanitize use options
        if (!vkdev->info.support_fp16_packed) opt.use_fp16_packed = false;
        if (!vkdev->info.support_fp16_storage) opt.use_fp16_storage = false;
        if (!vkdev->info.support_fp16_arithmetic) opt.use_fp16_arithmetic = false;
        if (!vkdev->info.support_int8_storage) opt.use_int8_storage = false;
        if (!vkdev->info.support_int8_arithmetic) opt.use_int8_arithmetic = false;
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    int blob_index = 0;
    for (int i=0; i<layer_count; i++)
    {
        char layer_type[256];
        char layer_name[256];
        int bottom_count = 0;
        int top_count = 0;
        SCAN_VALUE("%255s", layer_type)
        SCAN_VALUE("%255s", layer_name)
        SCAN_VALUE("%d", bottom_count)
        SCAN_VALUE("%d", top_count)

        Layer* layer = create_layer(layer_type);
        if (!layer)
        {
            layer = create_custom_layer(layer_type);
        }
        if (!layer)
        {
            fprintf(stderr, "layer %s not exists or registered\n", layer_type);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
            layer->vkdev = vkdev;
#endif // NCNN_VULKAN

        layer->type = std::string(layer_type);
        layer->name = std::string(layer_name);
//         fprintf(stderr, "new layer %d %s\n", i, layer_name);

        layer->bottoms.resize(bottom_count);

        for (int j=0; j<bottom_count; j++)
        {
            char bottom_name[256];
            SCAN_VALUE("%255s", bottom_name)

            int bottom_blob_index = find_blob_index_by_name(bottom_name);
            if (bottom_blob_index == -1)
            {
                Blob& blob = blobs[blob_index];

                bottom_blob_index = blob_index;

                blob.name = std::string(bottom_name);
//                 fprintf(stderr, "new blob %s\n", bottom_name);

                blob_index++;
            }

            Blob& blob = blobs[bottom_blob_index];

            blob.consumers.push_back(i);

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j=0; j<top_count; j++)
        {
            Blob& blob = blobs[blob_index];

            char blob_name[256];
            SCAN_VALUE("%255s", blob_name)

            blob.name = std::string(blob_name);
//             fprintf(stderr, "new blob %s\n", blob_name);

            blob.producer = i;

            layer->tops[j] = blob_index;

            blob_index++;
        }

        // layer specific params
        int pdlr = pd.load_param(dr);
        if (pdlr != 0)
        {
            fprintf(stderr, "ParamDict load_param failed\n");
            continue;
        }

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
            fprintf(stderr, "layer load_param failed\n");
            continue;
        }

        layers[i] = layer;
    }

#undef SCAN_VALUE
    return 0;
}